

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_stuff.cpp
# Opt level: O3

bool ST_Responder(event_t *ev)

{
  bool bVar1;
  int numcheats;
  cheatseq_t *cheats;
  cheatseq_t **ppcVar2;
  ulong uVar3;
  int *piVar4;
  
  if (allcheats.Value) {
    uVar3 = 0xffffffffffffffff;
    piVar4 = ST_Responder::counts;
    ppcVar2 = ST_Responder::cheatlists;
    do {
      bVar1 = CheatCheckList(ev,*ppcVar2,*piVar4);
      if (bVar1) {
        return true;
      }
      uVar3 = uVar3 + 1;
      piVar4 = piVar4 + 1;
      ppcVar2 = ppcVar2 + 1;
    } while (uVar3 != 5);
    return uVar3 < 5;
  }
  switch(gameinfo.gametype) {
  case GAME_Doom:
    numcheats = 0x11;
    cheats = DoomCheats;
    break;
  case GAME_Heretic:
    numcheats = 0x19;
    cheats = HereticCheats;
    break;
  case GAME_Heretic|GAME_Doom:
  case GAME_Hexen|GAME_Doom:
  case GAME_Raven:
  case GAME_Raven|GAME_Doom:
    return false;
  case GAME_Hexen:
    numcheats = 0xd;
    cheats = HexenCheats;
    break;
  case GAME_Strife:
    numcheats = 0x16;
    cheats = StrifeCheats;
    break;
  default:
    if (gameinfo.gametype != GAME_Chex) {
      return false;
    }
    numcheats = 0xf;
    cheats = ChexCheats;
  }
  bVar1 = CheatCheckList(ev,cheats,numcheats);
  return bVar1;
}

Assistant:

bool ST_Responder (event_t *ev)
{
	bool eat = false;

	if (!allcheats)
	{
		cheatseq_t *cheats;
		int numcheats;

		switch (gameinfo.gametype)
		{
		case GAME_Doom:
			cheats = DoomCheats;
			numcheats = countof(DoomCheats);
			break;

		case GAME_Heretic:
			cheats = HereticCheats;
			numcheats = countof(HereticCheats);
			break;

		case GAME_Hexen:
			cheats = HexenCheats;
			numcheats = countof(HexenCheats);
			break;

		case GAME_Strife:
			cheats = StrifeCheats;
			numcheats = countof(StrifeCheats);
			break;

		case GAME_Chex:
			cheats = ChexCheats;
			numcheats = countof(ChexCheats);
			break;

		default:
			return false;
		}
		return CheatCheckList(ev, cheats, numcheats);
	}
	else
	{
		static cheatseq_t *cheatlists[] = { DoomCheats, HereticCheats, HexenCheats, StrifeCheats, ChexCheats, SpecialCheats };
		static int counts[] = { countof(DoomCheats), countof(HereticCheats)-2, countof(HexenCheats), 
								countof(StrifeCheats), countof(ChexCheats)-1, countof(SpecialCheats) };

		for (size_t i=0; i<countof(cheatlists); i++)
		{
			if (CheatCheckList(ev, cheatlists[i], counts[i])) return true;
		}
	}
	return false;
}